

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPrs.h
# Opt level: O0

int Psr_NtkSigName(Psr_Ntk_t *p,int i)

{
  int iVar1;
  int i_local;
  Psr_Ntk_t *p_local;
  
  p_local._4_4_ = i;
  if (((byte)p->field_0x4 >> 1 & 1) != 0) {
    iVar1 = Abc_Lit2Att2(i);
    if (iVar1 != 0) {
      __assert_fail("Abc_Lit2Att2(i) == BAC_PRS_NAME",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacPrs.h"
                    ,0x77,"int Psr_NtkSigName(Psr_Ntk_t *, int)");
    }
    p_local._4_4_ = Abc_Lit2Var2(i);
  }
  return p_local._4_4_;
}

Assistant:

static inline int         Psr_NtkSigName( Psr_Ntk_t * p, int i )       { if (!p->fSlices) return i; assert(Abc_Lit2Att2(i) == BAC_PRS_NAME); return Abc_Lit2Var2(i); }